

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O2

Parsekey __thiscall
free_format_parser::HMpsFF::parseRhs(HMpsFF *this,HighsLogOptions *log_options,istream *file)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_00;
  HMpsFF *this_01;
  bool bVar1;
  __type _Var2;
  Parsekey PVar3;
  iterator iVar4;
  size_t sVar5;
  HighsInt id;
  size_t *end;
  bool *has_entry_00;
  char *format;
  HMpsFF *pHVar6;
  double val;
  bool has_entry;
  bool skip;
  HighsLogOptions *local_120;
  Parsekey local_118;
  HighsInt rowidx;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  string marker;
  size_t local_c8;
  double local_c0;
  HMpsFF *local_b8;
  size_t begin;
  anon_class_8_1_8991fb9c addRhs;
  anon_class_8_1_8991fb9c parseName;
  bool is_nan;
  string word;
  string strline;
  
  strline._M_dataplus._M_p = (pointer)&strline.field_2;
  strline._M_string_length = 0;
  strline.field_2._M_local_buf[0] = '\0';
  pHVar6 = (HMpsFF *)&this->has_row_entry_;
  local_120 = log_options;
  addRhs.this = this;
  parseName.this = this;
  std::vector<bool,_std::allocator<bool>_>::_M_fill_assign
            ((vector<bool,_std::allocator<bool>_> *)pHVar6,(long)this->num_row,false);
  this->has_obj_entry_ = false;
  has_entry = false;
  this_00 = &this->rowname2idx;
  local_118 = kFail;
  local_f8 = 0;
  local_110 = 1;
  local_108 = 1;
  local_100 = 0;
  local_b8 = this;
LAB_0022409f:
  do {
    bVar1 = getMpsLine(pHVar6,file,&strline,&skip);
    this_01 = local_b8;
    if (!bVar1) {
LAB_0022465f:
      std::__cxx11::string::~string((string *)&strline);
      return local_118;
    }
  } while (skip != false);
  bVar1 = timeout(local_b8);
  if (bVar1) {
    local_118 = kTimeout;
    goto LAB_0022465f;
  }
  begin = 0;
  local_c8 = 0;
  word._M_dataplus._M_p = (pointer)&word.field_2;
  word._M_string_length = 0;
  word.field_2._M_local_buf[0] = '\0';
  end = &local_c8;
  PVar3 = checkFirstWord(this_01,&strline,&begin,end,&word);
  id = (HighsInt)end;
  if (PVar3 != kRhs) {
    if (PVar3 != kNone) {
      local_b8->warning_issued_ = local_100 != 0 || local_f8 != 0;
      if (local_100 != 0 || local_f8 != 0) {
        highsLogUser(local_120,kWarning,
                     "RHS section: ignored %d undefined rows and %d duplicate values\n");
      }
      highsLogDev(local_120,kInfo,"readMPS: Read RHS     OK\n");
      std::__cxx11::string::~string((string *)&word);
      local_118 = PVar3;
      goto LAB_0022465f;
    }
    iVar4 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&this_00->_M_h,(key_type *)&word);
    if (iVar4.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
        ._M_cur != (__node_type *)0x0) {
      local_c8 = begin;
    }
  }
  sVar5 = local_c8;
  first_word(&marker,&strline,local_c8);
  sVar5 = first_word_end(&strline,sVar5);
  std::__cxx11::string::assign((char *)&word);
  first_word((string *)&is_nan,&strline,sVar5);
  std::__cxx11::string::operator=((string *)&word,(string *)&is_nan);
  std::__cxx11::string::~string((string *)&is_nan);
  sVar5 = first_word_end(&strline,sVar5);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&word
                          ,"");
  if (bVar1) {
    trim(&marker,&default_non_chars_abi_cxx11_);
    highsLogUser(local_120,kError,"No bound given for row \"%s\"\n",marker._M_dataplus._M_p);
  }
  else {
    pHVar6 = (HMpsFF *)this_00;
    iVar4 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&this_00->_M_h,&marker);
    if (iVar4.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
        ._M_cur != (__node_type *)0x0) {
LAB_002241da:
      is_nan = false;
      local_c0 = getValue(pHVar6,&word,&is_nan,id);
      parseRhs::anon_class_8_1_8991fb9c::operator()(&parseName,&marker,&rowidx,&has_entry);
      if (has_entry == true) {
        local_f8 = local_f8 + 1;
        if (local_f8 % local_108 == 0) {
          highsLogUser(local_120,kWarning,
                       "Row name \"%s\" in RHS section has duplicate value %g: ignored\n",local_c0,
                       marker._M_dataplus._M_p);
          local_108 = local_108 * 2;
        }
      }
      else {
        if (is_nan == true) {
          highsLogUser(local_120,kError,"RHS for row \"%s\" is NaN\n",marker._M_dataplus._M_p);
          goto LAB_00224648;
        }
        parseRhs::anon_class_8_1_8991fb9c::operator()(&addRhs,local_c0,rowidx);
      }
LAB_00224384:
      bVar1 = is_end(&strline,sVar5,&default_non_chars_abi_cxx11_);
      if (!bVar1) {
        first_word((string *)&is_nan,&strline,sVar5);
        std::__cxx11::string::operator=((string *)&marker,(string *)&is_nan);
        std::__cxx11::string::~string((string *)&is_nan);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&word,"");
        if (bVar1) {
          trim(&marker,&default_non_chars_abi_cxx11_);
          format = "No coefficient given for rhs of row \"%s\"\n";
          goto LAB_00224634;
        }
        sVar5 = first_word_end(&strline,sVar5);
        std::__cxx11::string::assign((char *)&word);
        first_word((string *)&is_nan,&strline,sVar5 + 1);
        std::__cxx11::string::operator=((string *)&word,(string *)&is_nan);
        std::__cxx11::string::~string((string *)&is_nan);
        first_word_end(&strline,sVar5 + 1);
        iVar4 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&this_00->_M_h,&marker);
        if (iVar4.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
            ._M_cur == (__node_type *)0x0) {
          local_100 = local_100 + 1;
          if (local_100 % local_110 == 0) {
            highsLogUser(local_120,kWarning,
                         "Row name \"%s\" in RHS section is not defined: ignored\n",
                         marker._M_dataplus._M_p);
            local_110 = local_110 * 2;
          }
        }
        else {
          pHVar6 = (HMpsFF *)&parseName;
          has_entry_00 = &has_entry;
          parseRhs::anon_class_8_1_8991fb9c::operator()
                    ((anon_class_8_1_8991fb9c *)pHVar6,&marker,&rowidx,has_entry_00);
          is_nan = false;
          val = getValue(pHVar6,&word,&is_nan,(HighsInt)has_entry_00);
          if (has_entry == true) {
            local_f8 = local_f8 + 1;
            if (local_f8 % local_108 == 0) {
              highsLogUser(local_120,kWarning,
                           "Row name \"%s\" in RHS section has duplicate value %g: ignored\n",
                           marker._M_dataplus._M_p);
              local_108 = local_108 * 2;
            }
          }
          else {
            if (is_nan == true) {
              highsLogUser(local_120,kError,"RHS for row \"%s\" is NaN\n",marker._M_dataplus._M_p);
              goto LAB_00224648;
            }
            parseRhs::anon_class_8_1_8991fb9c::operator()(&addRhs,val,rowidx);
          }
        }
      }
      std::__cxx11::string::~string((string *)&marker);
      pHVar6 = (HMpsFF *)&word;
      std::__cxx11::string::~string((string *)&word);
      goto LAB_0022409f;
    }
    _Var2 = std::operator==(&marker,&this->mps_name);
    if (!_Var2) {
LAB_00224343:
      local_100 = local_100 + 1;
      if (local_100 % local_110 == 0) {
        highsLogUser(local_120,kWarning,"Row name \"%s\" in RHS section is not defined: ignored\n",
                     marker._M_dataplus._M_p);
        local_110 = local_110 * 2;
      }
      goto LAB_00224384;
    }
    std::__cxx11::string::_M_assign((string *)&marker);
    std::__cxx11::string::assign((char *)&word);
    first_word((string *)&is_nan,&strline,sVar5);
    std::__cxx11::string::operator=((string *)&word,(string *)&is_nan);
    std::__cxx11::string::~string((string *)&is_nan);
    sVar5 = first_word_end(&strline,sVar5);
    local_c8 = sVar5;
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &word,"");
    if (!bVar1) {
      pHVar6 = (HMpsFF *)this_00;
      iVar4 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&this_00->_M_h,&marker);
      if (iVar4.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
          ._M_cur != (__node_type *)0x0) goto LAB_002241da;
      goto LAB_00224343;
    }
    trim(&marker,&default_non_chars_abi_cxx11_);
    format = "No bound given for SIF row \"%s\"\n";
LAB_00224634:
    highsLogUser(local_120,kError,format,marker._M_dataplus._M_p);
  }
LAB_00224648:
  std::__cxx11::string::~string((string *)&marker);
  std::__cxx11::string::~string((string *)&word);
  goto LAB_0022465f;
}

Assistant:

HMpsFF::Parsekey HMpsFF::parseRhs(const HighsLogOptions& log_options,
                                  std::istream& file) {
  std::string strline;

  auto parseName = [this](const std::string& name, HighsInt& rowidx,
                          bool& has_entry) {
    auto mit = rowname2idx.find(name);

    assert(mit != rowname2idx.end());
    rowidx = mit->second;

    assert(rowidx < num_row);

    if (rowidx > -1) {
      has_entry = has_row_entry_[rowidx];
    } else {
      assert(rowidx == -1);
      has_entry = has_obj_entry_;
    }
  };

  auto addRhs = [this](double val, HighsInt rowidx) {
    if (rowidx > -1) {
      if (row_type[rowidx] == Boundtype::kEq ||
          row_type[rowidx] == Boundtype::kLe) {
        assert(size_t(rowidx) < row_upper.size());
        row_upper[rowidx] = val;
      }
      if (row_type[rowidx] == Boundtype::kEq ||
          row_type[rowidx] == Boundtype::kGe) {
        assert(size_t(rowidx) < row_lower.size());
        row_lower[rowidx] = val;
      }
      has_row_entry_[rowidx] = true;
    } else {
      // objective shift
      assert(rowidx == -1);
      obj_offset = -val;
      has_obj_entry_ = true;
    }
  };

  // Initialise tracking for duplicate entries
  has_row_entry_.assign(num_row, false);
  has_obj_entry_ = false;
  bool has_entry = false;

  bool skip;
  size_t num_ignored_row_name = 0;
  size_t report_ignored_row_name_frequency = 1;
  size_t num_ignored_duplicate_rhs = 0;
  size_t report_ignored_duplicate_rhs_frequency = 1;
  while (getMpsLine(file, strline, skip)) {
    if (skip) continue;
    if (timeout()) return HMpsFF::Parsekey::kTimeout;

    size_t begin = 0;
    size_t end = 0;
    std::string word;
    HMpsFF::Parsekey key = checkFirstWord(strline, begin, end, word);

    // start of new section?
    if (key != Parsekey::kNone && key != Parsekey::kRhs) {
      warning_issued_ =
          num_ignored_row_name > 0 || num_ignored_duplicate_rhs > 0;
      if (warning_issued_)
        highsLogUser(
            log_options, HighsLogType::kWarning,
            "RHS section: ignored %d undefined rows and %d duplicate values\n",
            int(num_ignored_row_name), int(num_ignored_duplicate_rhs));
      highsLogDev(log_options, HighsLogType::kInfo,
                  "readMPS: Read RHS     OK\n");
      return key;
    }

    // Ignore lack of name for SIF format;
    // we know we have this case when "word" is a row name
    if ((key == Parsekey::kNone) && (key != Parsekey::kRhs) &&
        (rowname2idx.find(word) != rowname2idx.end())) {
      end = begin;
    }

    HighsInt rowidx;

    std::string marker = first_word(strline, end);
    size_t end_marker = first_word_end(strline, end);

    // here marker is the row name and end marks its end
    word = "";
    word = first_word(strline, end_marker);
    end = first_word_end(strline, end_marker);

    if (word == "") {
      trim(marker);
      highsLogUser(log_options, HighsLogType::kError,
                   "No bound given for row \"%s\"\n", marker.c_str());
      return HMpsFF::Parsekey::kFail;
    }

    auto mit = rowname2idx.find(marker);

    // SIF format sometimes has the name of the MPS file
    // prepended to the RHS entry; remove it here if
    // that's the case. "word" will then hold the marker,
    // so also get new "word" and "end" values
    if (mit == rowname2idx.end()) {
      if (marker == mps_name) {
        marker = word;
        end_marker = end;
        word = "";
        word = first_word(strline, end_marker);
        end = first_word_end(strline, end_marker);
        if (word == "") {
          trim(marker);
          highsLogUser(log_options, HighsLogType::kError,
                       "No bound given for SIF row \"%s\"\n", marker.c_str());
          return HMpsFF::Parsekey::kFail;
        }
        mit = rowname2idx.find(marker);
      }
    }

    if (mit == rowname2idx.end()) {
      num_ignored_row_name++;
      if (num_ignored_row_name % report_ignored_row_name_frequency == 0) {
        highsLogUser(log_options, HighsLogType::kWarning,
                     "Row name \"%s\" in RHS section is not defined: ignored\n",
                     marker.c_str());
        report_ignored_row_name_frequency *= 2;
      }
    } else {
      bool is_nan = false;
      double value = getValue(word, is_nan);  // atof(word.c_str());
      parseName(marker, rowidx, has_entry);
      if (has_entry) {
        num_ignored_duplicate_rhs++;
        if (num_ignored_duplicate_rhs %
                report_ignored_duplicate_rhs_frequency ==
            0) {
          highsLogUser(log_options, HighsLogType::kWarning,
                       "Row name \"%s\" in RHS section has duplicate value %g: "
                       "ignored\n",
                       marker.c_str(), value);
          report_ignored_duplicate_rhs_frequency *= 2;
        }
      } else {
        if (is_nan) {
          highsLogUser(log_options, HighsLogType::kError,
                       "RHS for row \"%s\" is NaN\n", marker.c_str());
          return HMpsFF::Parsekey::kFail;
        }
        addRhs(value, rowidx);
      }
    }

    if (!is_end(strline, end)) {
      // parse second coefficient
      marker = first_word(strline, end);
      if (word == "") {
        trim(marker);
        highsLogUser(log_options, HighsLogType::kError,
                     "No coefficient given for rhs of row \"%s\"\n",
                     marker.c_str());
        return HMpsFF::Parsekey::kFail;
      }
      end_marker = first_word_end(strline, end);

      // here marker is the row name and end marks its end
      word = "";
      end_marker++;
      word = first_word(strline, end_marker);
      end = first_word_end(strline, end_marker);

      assert(is_end(strline, end));

      auto mit = rowname2idx.find(marker);
      if (mit == rowname2idx.end()) {
        num_ignored_row_name++;
        if (num_ignored_row_name % report_ignored_row_name_frequency == 0) {
          highsLogUser(
              log_options, HighsLogType::kWarning,
              "Row name \"%s\" in RHS section is not defined: ignored\n",
              marker.c_str());
          report_ignored_row_name_frequency *= 2;
        }
        continue;
      };

      parseName(marker, rowidx, has_entry);
      bool is_nan = false;
      double value = getValue(word, is_nan);  // atof(word.c_str());
      if (has_entry) {
        num_ignored_duplicate_rhs++;
        if (num_ignored_duplicate_rhs %
                report_ignored_duplicate_rhs_frequency ==
            0) {
          highsLogUser(log_options, HighsLogType::kWarning,
                       "Row name \"%s\" in RHS section has duplicate value %g: "
                       "ignored\n",
                       marker.c_str(), value);
          report_ignored_duplicate_rhs_frequency *= 2;
        }
      } else {
        if (is_nan) {
          highsLogUser(log_options, HighsLogType::kError,
                       "RHS for row \"%s\" is NaN\n", marker.c_str());
          return HMpsFF::Parsekey::kFail;
        }
        addRhs(value, rowidx);
      }
    }
  }

  return Parsekey::kFail;
}